

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ProcessGetCFilters
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  string *this_00;
  CNode *in_RCX;
  ConstevalFormatString<3U> in_RDX;
  string *in_RSI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  uint32_t unaff_retaddr;
  Level in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  uint *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  uint32_t in_stack_00000050;
  CBlockIndex **in_stack_00000058;
  BlockFilterIndex **in_stack_00000060;
  BlockFilter *filter;
  vector<BlockFilter,_std::allocator<BlockFilter>_> *__range1;
  BlockFilterType filter_type;
  iterator __end1;
  iterator __begin1;
  vector<BlockFilter,_std::allocator<BlockFilter>_> filters;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint32_t start_height;
  uint8_t filter_type_ser;
  uint256 stop_hash;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe6c;
  uint256 *in_stack_fffffffffffffe70;
  base_blob<256U> *this_01;
  DataStream *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  BlockFilter *in_stack_fffffffffffffe98;
  CNode *node_00;
  PeerManagerImpl *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined8 in_stack_fffffffffffffed8;
  int start_height_00;
  BlockFilterIndex *in_stack_fffffffffffffee0;
  uint256 *in_stack_fffffffffffffef8;
  BlockFilterType in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff08;
  string *psVar3;
  CBlockIndex *pCVar4;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined1 local_69;
  undefined8 local_8;
  
  start_height_00 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = in_RDI;
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  DataStream::operator>>(in_stack_fffffffffffffe78,(uchar *)in_stack_fffffffffffffe70);
  DataStream::operator>>(in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70);
  DataStream::operator>>(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  this_01 = (base_blob<256U> *)&stack0xffffffffffffff88;
  this_00 = (string *)&stack0xffffffffffffff80;
  uVar2 = 1000;
  bVar1 = PrepareBlockFilterRequest
                    ((PeerManagerImpl *)in_RDX.fmt,in_RCX,
                     (Peer *)CONCAT17(local_69,in_stack_ffffffffffffff08),in_stack_ffffffffffffff07,
                     unaff_retaddr,in_stack_fffffffffffffef8,in_stack_00000050,in_stack_00000058,
                     in_stack_00000060);
  if (bVar1) {
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::vector
              ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)
               CONCAT44(in_stack_fffffffffffffe6c,uVar2));
    bVar1 = BlockFilterIndex::LookupFilterRange
                      (in_stack_fffffffffffffee0,start_height_00,in_RDI,
                       (vector<BlockFilter,_std::allocator<BlockFilter>_> *)
                       CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (bVar1) {
      std::vector<BlockFilter,_std::allocator<BlockFilter>_>::begin
                ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)this_01);
      std::vector<BlockFilter,_std::allocator<BlockFilter>_>::end
                ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)this_01);
      while (bVar1 = __gnu_cxx::
                     operator==<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>
                               ((__normal_iterator<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>
                                 *)this_00,
                                (__normal_iterator<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>
                                 *)this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>::
        operator*((__normal_iterator<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe6c,uVar2));
        node_00 = (CNode *)&stack0xffffffffffffff37;
        psVar3 = in_RSI;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                   (char *)in_stack_fffffffffffffeb0,(allocator<char> *)node_00);
        (anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<BlockFilter_const&>
                  (in_stack_fffffffffffffeb0,node_00,in_RSI,in_stack_fffffffffffffe98);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,uVar2));
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
        __gnu_cxx::
        __normal_iterator<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>::
        operator++((__normal_iterator<BlockFilter_*,_std::vector<BlockFilter,_std::allocator<BlockFilter>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe6c,uVar2));
        in_RSI = psVar3;
      }
    }
    else {
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe6c,uVar2),Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        this_00 = BlockFilterTypeName_abi_cxx11_
                            ((BlockFilterType)((ulong)in_stack_fffffffffffffe88 >> 0x38));
        base_blob<256u>::ToString_abi_cxx11_(this_01);
        uVar2 = 1;
        logging_function._M_str = in_stack_ffffffffffffff38;
        logging_function._M_len = in_stack_ffffffffffffff30;
        source_file._M_str = (char *)pCVar4;
        source_file._M_len = (size_t)in_RSI;
        LogPrintFormatInternal<std::__cxx11::string,unsigned_int,std::__cxx11::string>
                  (logging_function,source_file,start_height_00,(LogFlags)in_RDI,in_stack_00000010,
                   in_RDX,in_stack_00000020,in_stack_00000028,in_stack_00000030);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,uVar2));
      }
    }
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::~vector
              ((vector<BlockFilter,_std::allocator<BlockFilter>_> *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFilters(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint32_t start_height;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> start_height >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, start_height, stop_hash,
                                   MAX_GETCFILTERS_SIZE, stop_index, filter_index)) {
        return;
    }

    std::vector<BlockFilter> filters;
    if (!filter_index->LookupFilterRange(start_height, stop_index, filters)) {
        LogDebug(BCLog::NET, "Failed to find block filter in index: filter_type=%s, start_height=%d, stop_hash=%s\n",
                     BlockFilterTypeName(filter_type), start_height, stop_hash.ToString());
        return;
    }

    for (const auto& filter : filters) {
        MakeAndPushMessage(node, NetMsgType::CFILTER, filter);
    }
}